

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O3

string * __thiscall
anurbs::Model::get_key_abi_cxx11_(string *__return_storage_ptr__,Model *this,size_t index)

{
  pointer puVar1;
  pointer psVar2;
  ulong uVar3;
  
  puVar1 = (this->m_entry_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->m_entry_map).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (index < uVar3) {
    index = puVar1[index];
    psVar2 = (this->m_entries).
             super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->m_entries).
                  super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4;
    if (index < uVar3) {
      (*(code *)*(psVar2[index].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_vptr_EntryBase)();
      return __return_storage_ptr__;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",index,uVar3
            );
}

Assistant:

std::string get_key(size_t index) const
    {
        return m_entries.at(m_entry_map.at(index))->key();
    }